

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::ReserveDestination::ReturnDestination(ReserveDestination *this)

{
  long in_FS_OFFSET;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nIndex != -1) {
    (*this->m_spk_man->_vptr_ScriptPubKeyMan[8])
              (this->m_spk_man,this->nIndex,(ulong)this->fInternal,&this->address);
  }
  this->nIndex = -1;
  local_38._16_8_ = 0;
  local_38._24_8_ = 0;
  local_38._0_8_ = (char *)0x0;
  local_38._8_8_ = 0;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
               *)&this->address,(CNoDestination *)local_38);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReserveDestination::ReturnDestination()
{
    if (nIndex != -1) {
        m_spk_man->ReturnDestination(nIndex, fInternal, address);
    }
    nIndex = -1;
    address = CNoDestination();
}